

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Loop.cc
# Opt level: O0

void __thiscall
RigidBodyDynamics::LoopConstraint::calcConstraintForces
          (LoopConstraint *this,Model *model,double time,VectorNd *Q,VectorNd *QDot,MatrixNd *GSys,
          VectorNd *LagMultSys,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *constraintBodiesUpd,
          vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          *constraintBodyFramesUpd,
          vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *constraintForcesUpd,
          ConstraintCache *cache,bool resolveAllInRootFrame,bool updateKinematics)

{
  reference pvVar1;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  *other;
  SpatialVector_t *this_00;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_RCX;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_RDX;
  Index in_RSI;
  Model *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000008;
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  *in_stack_00000010;
  vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *in_stack_00000018;
  long in_stack_00000020;
  byte in_stack_00000028;
  uint i;
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
  *in_stack_fffffffffffffab8;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffac0;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>
  *in_stack_fffffffffffffac8;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>
  *in_stack_fffffffffffffad0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
  *in_stack_fffffffffffffad8;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *pDVar2;
  Index startCol;
  Index startRow;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *this_01;
  undefined4 in_stack_fffffffffffffb08;
  value_type vVar3;
  undefined8 in_stack_fffffffffffffb38;
  VectorNd *in_stack_fffffffffffffb40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffb58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffb60;
  SpatialVector *in_stack_fffffffffffffc80;
  SpatialTransform *in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffccf;
  Vector3d *in_stack_fffffffffffffcd0;
  uint in_stack_fffffffffffffcdc;
  VectorNd *in_stack_fffffffffffffce0;
  Model *in_stack_fffffffffffffce8;
  uint local_134;
  
  pDVar2 = in_RDX;
  startCol = in_RSI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RCX,
             (size_type)in_stack_fffffffffffffad8);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::resize((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
            *)in_RCX,(size_type)in_stack_fffffffffffffad8);
  startRow = in_RSI;
  this_01 = in_RDX;
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      &(in_RDI->mu).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,0);
  vVar3 = *pvVar1;
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)&in_RDI->qdot_size,0);
  CalcBodyToBaseCoordinates
            (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
             in_stack_fffffffffffffcd0,(bool)in_stack_fffffffffffffccf);
  Vector3_t::operator=
            ((Vector3_t *)in_stack_fffffffffffffac0,(Vector3_t *)in_stack_fffffffffffffab8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &(in_RDI->mu).
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,0);
  CalcBodyWorldOrientation
            (in_RDI,in_stack_fffffffffffffb40,(uint)((ulong)in_stack_fffffffffffffb38 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffb38 >> 0x18,0));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffab8);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)&in_RDI->qdot_size,0);
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
            ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
             in_stack_fffffffffffffac0,
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffab8);
  Matrix3_t::operator=((Matrix3_t *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &(in_RDI->mu).
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,1);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)&in_RDI->qdot_size,1);
  CalcBodyToBaseCoordinates
            (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
             in_stack_fffffffffffffcd0,(bool)in_stack_fffffffffffffccf);
  Vector3_t::operator=
            ((Vector3_t *)in_stack_fffffffffffffac0,(Vector3_t *)in_stack_fffffffffffffab8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &(in_RDI->mu).
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,1);
  CalcBodyWorldOrientation
            (in_RDI,(VectorNd *)in_RDX,(uint)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0))
  ;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffab8);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)&in_RDI->qdot_size,1);
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
            ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
             in_stack_fffffffffffffac0,
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffab8);
  Matrix3_t::operator=((Matrix3_t *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::resize
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)in_RCX,
             (size_type)in_stack_fffffffffffffad8);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            (in_stack_00000018,0);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero(in_stack_fffffffffffffac0);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            (in_stack_00000018,1);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero(in_stack_fffffffffffffac0);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero(in_stack_fffffffffffffac0);
  for (local_134 = 0;
      local_134 <
      *(uint *)&(in_RDI->mu).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; local_134 = local_134 + 1) {
    in_stack_fffffffffffffad0 =
         (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_> *)
         (in_stack_00000020 + 0x470);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               &(in_RDI->X_J).
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                .
                super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ._M_impl.super__Vector_impl_data._M_finish,(ulong)local_134);
    Math::SpatialTransform::apply(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    SpatialVector_t::operator=
              ((SpatialVector_t *)in_stack_fffffffffffffac0,
               (SpatialVector_t *)in_stack_fffffffffffffab8);
    in_stack_fffffffffffffad8 =
         (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
          *)(in_stack_00000020 + 0x350);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
               in_stack_fffffffffffffac0,(Index)in_stack_fffffffffffffab8);
    Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
              ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
               CONCAT44(vVar3,in_stack_fffffffffffffb08),(double *)this_01);
    Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+=(in_RCX,in_stack_fffffffffffffad8)
    ;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RCX,
             (size_type)in_stack_fffffffffffffad8);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::resize((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
            *)in_RCX,(size_type)in_stack_fffffffffffffad8);
  if ((in_stack_00000028 & 1) == 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator=((vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 *)in_stack_fffffffffffffac0,
                (vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 *)in_stack_fffffffffffffab8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffab8);
    Eigen::DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>::operator-
              ((DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
               in_stack_fffffffffffffad8);
    Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<int,int>
              (this_01,startRow,startCol,(int)((ulong)pDVar2 >> 0x20),(int)pDVar2);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>>
    ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                 *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              (in_stack_00000018,0);
    Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<int,int>
              (this_01,startRow,startCol,(int)((ulong)pDVar2 >> 0x20),(int)pDVar2);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false> *)
               in_stack_fffffffffffffac0,
               (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>_>
                *)in_stack_fffffffffffffab8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffab8);
    Eigen::DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>::operator-
              ((DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
               in_stack_fffffffffffffad8);
    Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<int,int>
              (this_01,startRow,startCol,(int)((ulong)pDVar2 >> 0x20),(int)pDVar2);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>>
    ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                 *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              (in_stack_00000018,0);
    Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<int,int>
              (this_01,startRow,startCol,(int)((ulong)pDVar2 >> 0x20),(int)pDVar2);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false> *)
               in_stack_fffffffffffffac0,
               (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>_>
                *)in_stack_fffffffffffffab8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffab8);
    Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<int,int>
              (this_01,startRow,startCol,(int)((ulong)pDVar2 >> 0x20),(int)pDVar2);
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
              ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
               in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              (in_stack_00000018,1);
    Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<int,int>
              (this_01,startRow,startCol,(int)((ulong)pDVar2 >> 0x20),(int)pDVar2);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false> *)
               in_stack_fffffffffffffac0,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>_>
                *)in_stack_fffffffffffffab8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffab8);
    Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<int,int>
              (this_01,startRow,startCol,(int)((ulong)pDVar2 >> 0x20),(int)pDVar2);
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
              ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
               in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              (in_stack_00000018,1);
    Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<int,int>
              (this_01,startRow,startCol,(int)((ulong)pDVar2 >> 0x20),(int)pDVar2);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false> *)
               in_stack_fffffffffffffac0,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>_>
                *)in_stack_fffffffffffffab8);
  }
  else {
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_stack_00000008,0);
    *pvVar1 = 0;
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_stack_00000008,1);
    *pvVar1 = 0;
    other = (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             *)(in_stack_00000020 + 0x4b8);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[](in_stack_00000010,0);
    Vector3_t::operator=((Vector3_t *)in_stack_fffffffffffffac0,(Vector3_t *)other);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[](in_stack_00000010,0);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
    this_00 = (SpatialVector_t *)(in_stack_00000020 + 0x518);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[](in_stack_00000010,1);
    Vector3_t::operator=((Vector3_t *)this_00,(Vector3_t *)other);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[](in_stack_00000010,1);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator-
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffad8);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              (in_stack_00000018,0);
    SpatialVector_t::operator=(this_00,other);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              (in_stack_00000018,1);
    SpatialVector_t::operator=(this_00,(SpatialVector_t *)other);
  }
  return;
}

Assistant:

void LoopConstraint::calcConstraintForces( 
              Model &model,
              const double time,
              const Math::VectorNd &Q,
              const Math::VectorNd &QDot,
              const Math::MatrixNd &GSys,
              const Math::VectorNd &LagMultSys,
              std::vector< unsigned int > &constraintBodiesUpd,
              std::vector< Math::SpatialTransform > &constraintBodyFramesUpd,
              std::vector< Math::SpatialVector > &constraintForcesUpd,
              ConstraintCache &cache,
              bool resolveAllInRootFrame,
              bool updateKinematics)
{
  constraintBodiesUpd.resize(2);
  constraintBodyFramesUpd.resize(2);

  cache.stA.r = CalcBodyToBaseCoordinates(model,Q,bodyIds[0],bodyFrames[0].r,
                                          updateKinematics);
  cache.stA.E = CalcBodyWorldOrientation(model,Q,bodyIds[0],updateKinematics
                                         ).transpose()*bodyFrames[0].E;
  cache.stB.r = CalcBodyToBaseCoordinates(model,Q,bodyIds[1],bodyFrames[1].r,
                                          updateKinematics);
  cache.stB.E = CalcBodyWorldOrientation(model,Q,bodyIds[1],updateKinematics
                                         ).transpose()*bodyFrames[1].E;

  constraintForcesUpd.resize(2);
  constraintForcesUpd[0].setZero();
  constraintForcesUpd[1].setZero();


  //Using Eqn. 8.30 of Featherstone. Note that this force is resolved in the
  //root frame.
  cache.svecB.setZero();
  for(unsigned int i=0; i<sizeOfConstraint;++i){
    cache.svecA =  cache.stA.apply(T[i]);
    cache.svecB += cache.svecA*LagMultSys[rowInSystem+i];
  }

  constraintBodiesUpd.resize(2);
  constraintBodyFramesUpd.resize(2);

  if(resolveAllInRootFrame){
    constraintBodiesUpd[0] = 0;
    constraintBodiesUpd[1] = 0;

    //These forces are returned in the coordinates of the
    //root frame but w.r.t. the respective points of the constaint
    constraintBodyFramesUpd[0].r = cache.stA.r;
    constraintBodyFramesUpd[0].E.Identity();

    constraintBodyFramesUpd[1].r = cache.stB.r;
    constraintBodyFramesUpd[1].E.Identity();

    //The forces applied to the successor body are equal and opposite
    constraintForcesUpd[0] = -cache.svecB;
    constraintForcesUpd[1] = cache.svecB;

  }else{

    constraintBodiesUpd     = bodyIds;
    constraintBodyFramesUpd = bodyFrames;

    constraintForcesUpd[0].block(0,0,3,1) = -cache.stA.E.transpose()
                                              *cache.svecB.block(0,0,3,1);
    constraintForcesUpd[0].block(3,0,3,1) = -cache.stA.E.transpose()
                                              *cache.svecB.block(3,0,3,1);


    constraintForcesUpd[1].block(0,0,3,1) = cache.stB.E.transpose()
                                              *cache.svecB.block(0,0,3,1);
    constraintForcesUpd[1].block(3,0,3,1) = cache.stB.E.transpose()
                                              *cache.svecB.block(3,0,3,1);



  }



}